

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

SpecConstant *
vkt::pipeline::anon_unknown_0::composite_case_internal::makeSpecConstant
          (SpecConstant *__return_storage_ptr__,string *specConstName,deUint32 specConstId,
          DataType type,int specValue)

{
  deUint32 size_;
  char *__s;
  GenericValue specValue_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string typeName;
  int specValue_local;
  DataType type_local;
  deUint32 specConstId_local;
  string *specConstName_local;
  
  typeName.field_2._12_4_ = specValue;
  __s = glu::getDataTypeName(type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::operator+(&local_120,"layout(constant_id = ${ID}) const ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_100,&local_120," ");
  std::operator+(&local_e0,&local_100,specConstName);
  std::operator+(&local_c0,&local_e0," = ");
  std::operator+(&local_a0,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_80,&local_a0,"(1);");
  size_ = getDataTypeScalarSizeBytes(type);
  specValue_ = makeValue(type,typeName.field_2._12_4_);
  SpecConstant::SpecConstant(__return_storage_ptr__,specConstId,&local_80,size_,specValue_);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

SpecConstant makeSpecConstant (const std::string specConstName, const deUint32 specConstId, const glu::DataType type, const int specValue)
{
	DE_ASSERT(glu::isDataTypeScalar(type));

	const std::string typeName(glu::getDataTypeName(type));

	return SpecConstant(
		specConstId,
		"layout(constant_id = ${ID}) const " + typeName + " " + specConstName + " = " + typeName + "(1);",
		getDataTypeScalarSizeBytes(type), makeValue(type, specValue));
}